

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this)

{
  bool bVar1;
  reference paVar2;
  ulong uVar3;
  AssertHelper local_138;
  Message local_130 [2];
  CfdException *anon_var_0_1;
  ByteData actual_1;
  char *pcStack_100;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_f0 [2];
  CfdException *anon_var_0;
  undefined1 local_d8 [8];
  ByteData actual;
  bool gtest_caught_expected;
  ConstCharPtr local_b0;
  ConstCharPtr gtest_msg;
  TweakPrivkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this_local;
  
  _secp = (pointer)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,_secp);
  __end1 = std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>::begin
                     (&tweak_privkey_error_vectors);
  test_vector.expect_mul.field_2._8_8_ =
       std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>::end
                 (&tweak_privkey_error_vectors);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
                                *)((long)&test_vector.expect_mul.field_2 + 8));
    if (!bVar1) {
      return;
    }
    paVar2 = __gnu_cxx::
             __normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_112_4_5aca4469::TweakPrivkeyTestVector
              ((anon_struct_112_4_5aca4469 *)&gtest_msg,paVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      testing::internal::ConstCharPtr::ConstCharPtr(&local_b0,"");
      bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_b0);
      if (bVar1) {
        actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec
                    ((ByteData *)local_d8,(ByteData *)&__range1);
          cfd::core::ByteData::~ByteData((ByteData *)local_d8);
        }
        if ((actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) goto LAB_004b37a5;
        local_b0.value =
             "Expected: ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x171,local_b0.value);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
      testing::Message::~Message(local_f0);
    }
LAB_004b37a5:
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff00,"");
      bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                        ((ConstCharPtr *)&stack0xffffffffffffff00);
      if (bVar1) {
        actual_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
                    ((ByteData *)&anon_var_0_1,(ByteData *)&__range1);
          cfd::core::ByteData::~ByteData((ByteData *)&anon_var_0_1);
        }
        if ((actual_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) goto LAB_004b3982;
        pcStack_100 = 
        "Expected: ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_130);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x177,pcStack_100);
      testing::internal::AssertHelper::operator=(&local_138,local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message(local_130);
    }
LAB_004b3982:
    anon_struct_112_4_5aca4469::~TweakPrivkeyTestVector((anon_struct_112_4_5aca4469 *)&gtest_msg);
    __gnu_cxx::
    __normal_iterator<const_TweakPrivkeyTestVector_*,_std::vector<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
  }
}